

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKbo.hpp
# Opt level: O0

Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
* __thiscall
Kernel::QKbo::atomsWithLvl<Kernel::NumTraits<Kernel::RealConstantType>>(QKbo *this,Literal *literal)

{
  TermList a1;
  bool bVar1;
  uint uVar2;
  TermList TVar3;
  Term *in_RDX;
  Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
  *in_RDI;
  QKbo *unaff_retaddr;
  TermList in_stack_00000008;
  int mainIdx;
  uint f;
  uint8_t level;
  TermList term;
  uint in_stack_ffffffffffffff24;
  Term *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 uVar4;
  uint in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  anon_class_1_1_a83b8aa4 in_stack_ffffffffffffff7f;
  TermList local_50;
  Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
  *local_48;
  TermList local_40;
  TermList local_38;
  uint local_2c;
  uint local_28;
  undefined1 local_21;
  TermList local_20;
  Term *local_18;
  
  local_18 = in_RDX;
  TermList::TermList(&local_20);
  local_28 = Term::functor(local_18);
  bVar1 = Literal::isEquality((Literal *)0x942a47);
  if (((bVar1) ||
      (in_stack_ffffffffffffff3c = local_28, uVar2 = NumTraits<Kernel::RealConstantType>::geqF(),
      in_stack_ffffffffffffff3c == uVar2)) ||
     (in_stack_ffffffffffffff38 = local_28, uVar2 = NumTraits<Kernel::RealConstantType>::greaterF(),
     in_stack_ffffffffffffff38 == uVar2)) {
    bVar1 = Literal::isEquality((Literal *)0x942a90);
    uVar4 = false;
    if (bVar1) {
      local_38 = Term::termArg(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
      local_40 = NumTraits<Kernel::RealConstantType>::zero();
      uVar4 = TermList::operator==(&local_38,&local_40);
    }
    local_2c = (uint)((bool)uVar4 != false);
    TVar3._content = (uint64_t)AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>::zero()
    ;
    local_50 = Term::termArg((Term *)TVar3._content,in_stack_ffffffffffffff24);
    bVar1 = TermList::operator==((TermList *)TVar3._content,&local_50);
    if (bVar1) {
      local_48 = (Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
                  *)Term::termArg((Term *)TVar3._content,in_stack_ffffffffffffff24);
    }
    else {
      Term::termArg((Term *)TVar3._content,in_stack_ffffffffffffff24);
      Term::termArg((Term *)TVar3._content,in_stack_ffffffffffffff24);
      NumTraits<Kernel::RealConstantType>::minus(TVar3);
      a1._content._4_4_ = in_stack_ffffffffffffff3c;
      a1._content._0_4_ = in_stack_ffffffffffffff38;
      TVar3._content._7_1_ = uVar4;
      TVar3._content._0_7_ = in_stack_ffffffffffffff30;
      local_48 = (Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
                  *)NumTraits<Kernel::RealConstantType>::add(a1,TVar3);
    }
    local_20._content = (uint64_t)local_48;
    bVar1 = Literal::isEquality((Literal *)0x942bd5);
    if (bVar1) {
      bVar1 = Literal::isPositive((Literal *)0x942be8);
      local_21 = !bVar1;
    }
    else {
      local_21 = 1;
    }
  }
  else {
    local_20 = Term::termArg(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
    bVar1 = Literal::isPositive((Literal *)0x942c50);
    local_21 = 2;
    if (!bVar1) {
      local_21 = 3;
    }
  }
  TVar3._content = local_20._content;
  signedAtoms<Kernel::NumTraits<Kernel::RealConstantType>>(unaff_retaddr,in_stack_00000008);
  Lib::
  Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
  ::
  map<Kernel::QKbo::atomsWithLvl<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::_lambda(auto:1)_1_>
            ((Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
              *)TVar3._content,in_stack_ffffffffffffff7f);
  Lib::
  Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
  ::~Option((Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
             *)0x942cc5);
  return in_RDI;
}

Assistant:

Option<AtomsWithLvl> atomsWithLvl(Literal* literal) const
  {
    using ASig = AlascaSignature<NumTraits>;
    ASS(AlascaState::interpretedPred(literal))
    TermList term;
    uint8_t level;
    auto f = literal->functor();
    if (literal->isEquality() || f == NumTraits::geqF() || f == NumTraits::greaterF()) {
      auto mainIdx = literal->isEquality() && literal->termArg(0) == NumTraits::zero() ? 1 : 0;

      term = ASig::zero() == literal->termArg(1 - mainIdx) 
           ? literal->termArg(mainIdx)
           : NumTraits::add(literal->termArg(0), NumTraits::minus(literal->termArg(1)));

      level = literal->isEquality() 
        ? (literal->isPositive() ? POS_EQ_LEVEL : NEG_EQ_LEVEL)
        :  INEQ_LEVEL;
    } else {
      ASS(f == NumTraits::isIntF());
      term = literal->termArg(0);
      level = literal->isPositive() ? POS_IS_INT_LEVEL : NEG_IS_INT_LEVEL;
    }

    return signedAtoms<NumTraits>(term)
      .map([level](auto atoms) {
          return std::make_tuple(std::move(atoms), level);
      });
  }